

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zArcIn.c
# Opt level: O1

size_t SzArEx_GetFileNameUtf16(CSzArEx *p,size_t fileIndex,UInt16 *dest)

{
  size_t sVar1;
  Byte *pBVar2;
  size_t sVar3;
  size_t sVar4;
  
  sVar1 = p->FileNameOffsets[fileIndex];
  sVar4 = p->FileNameOffsets[fileIndex + 1];
  sVar3 = sVar4 - sVar1;
  if ((dest != (UInt16 *)0x0) && (sVar4 != sVar1)) {
    pBVar2 = p->FileNames;
    sVar4 = 0;
    do {
      dest[sVar4] = *(UInt16 *)(pBVar2 + sVar4 * 2 + sVar1 * 2);
      sVar4 = sVar4 + 1;
    } while (sVar3 != sVar4);
  }
  return sVar3;
}

Assistant:

size_t SzArEx_GetFileNameUtf16(const CSzArEx *p, size_t fileIndex, UInt16 *dest)
{
  size_t offs = p->FileNameOffsets[fileIndex];
  size_t len = p->FileNameOffsets[fileIndex + 1] - offs;
  if (dest != 0)
  {
    size_t i;
    const Byte *src = p->FileNames + offs * 2;
    for (i = 0; i < len; i++)
      dest[i] = GetUi16(src + i * 2);
  }
  return len;
}